

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O3

uint nullcDebugGetSourceLocationModuleIndex(char *sourceLocation)

{
  uint *puVar1;
  ulong uVar2;
  char *pcVar3;
  
  if (((sourceLocation != (char *)0x0) && (NULLC::linker != 0)) &&
     ((ulong)*(uint *)(NULLC::linker + 0x28c) != 0)) {
    puVar1 = (uint *)(*(long *)(NULLC::linker + 0x280) + 0x18);
    uVar2 = 0;
    do {
      pcVar3 = (char *)((ulong)puVar1[-1] + *(long *)(NULLC::linker + 0x2a0));
      if ((pcVar3 <= sourceLocation) && (sourceLocation < pcVar3 + *puVar1)) {
        return (uint)uVar2;
      }
      uVar2 = uVar2 + 1;
      puVar1 = puVar1 + 7;
    } while (*(uint *)(NULLC::linker + 0x28c) != uVar2);
  }
  return 0xffffffff;
}

Assistant:

unsigned nullcDebugGetSourceLocationModuleIndex(const char *sourceLocation)
{
	if(!sourceLocation)
		return ~0u;

	unsigned moduleCount = 0;
	ExternModuleInfo *modules = nullcDebugModuleInfo(&moduleCount);

	const char* fullSource = nullcDebugSource();

	for(unsigned i = 0; i < moduleCount; i++)
	{
		ExternModuleInfo &moduleInfo = modules[i];

		const char *start = fullSource + moduleInfo.sourceOffset;
		const char *end = start + moduleInfo.sourceSize;

		if(sourceLocation >= start && sourceLocation < end)
			return i;
	}

	return ~0u;
}